

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

UBool __thiscall icu_63::UVector::operator==(UVector *this,UVector *other)

{
  UBool UVar1;
  int local_24;
  int32_t i;
  UVector *other_local;
  UVector *this_local;
  
  if (this->count == other->count) {
    if (this->comparer != (UElementsAreEqual *)0x0) {
      for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
        UVar1 = (*this->comparer)((UElement)this->elements[local_24].pointer,
                                  (UElement)other->elements[local_24].pointer);
        if (UVar1 == '\0') {
          return '\0';
        }
      }
    }
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool UVector::operator==(const UVector& other) {
    int32_t i;
    if (count != other.count) return FALSE;
    if (comparer != NULL) {
        // Compare using this object's comparer
        for (i=0; i<count; ++i) {
            if (!(*comparer)(elements[i], other.elements[i])) {
                return FALSE;
            }
        }
    }
    return TRUE;
}